

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O2

float __thiscall
Rml::ElementAnimation::GetInterpolationFactorAndKeys
          (ElementAnimation *this,int *out_key0,int *out_key1)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  pointer pAVar5;
  ulong uVar6;
  int iVar7;
  pointer pAVar8;
  uint uVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  
  fVar11 = this->time_since_iteration_start;
  if (this->reverse_direction != false) {
    fVar11 = this->duration - fVar11;
  }
  pAVar5 = (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = ((long)(this->keys).
                 super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pAVar5) / 0x68;
  uVar10 = 0;
  uVar3 = (uint)uVar4;
  uVar6 = 0;
  pAVar8 = pAVar5;
  if (0 < (int)uVar3) {
    uVar6 = uVar4 & 0xffffffff;
  }
  for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
    if (fVar11 <= pAVar8->time) goto LAB_00288c5f;
    pAVar8 = pAVar8 + 1;
  }
  uVar10 = (ulong)(uVar3 - 1);
LAB_00288c5f:
  uVar9 = (uint)uVar10;
  iVar7 = uVar9 - 1;
  if (uVar9 == 0) {
    iVar7 = 0;
  }
  if ((((iVar7 < 0) || (uVar3 <= uVar9)) || ((int)uVar9 < 0)) || ((int)uVar3 <= iVar7)) {
    bVar2 = Assert("RMLUI_ASSERT(key0 >= 0 && key0 < (int)keys.size() && key1 >= 0 && key1 < (int)keys.size())"
                   ,
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ElementAnimation.cpp"
                   ,0x2e3);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pAVar5 = (this->keys).super__Vector_base<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  fVar12 = pAVar5[(int)uVar9].time - pAVar5[iVar7].time;
  fVar12 = (float)(-(uint)(0.001 < fVar12) & (uint)((fVar11 - pAVar5[iVar7].time) / fVar12));
  fVar11 = 1.0;
  if (fVar12 <= 1.0) {
    fVar11 = fVar12;
  }
  fVar11 = Tween::operator()(&pAVar5[(int)uVar9].tween,
                             (float)(~-(uint)(fVar12 < 0.0) & (uint)fVar11));
  if (out_key0 != (int *)0x0) {
    *out_key0 = iVar7;
  }
  if (out_key1 != (int *)0x0) {
    *out_key1 = uVar9;
  }
  return fVar11;
}

Assistant:

float ElementAnimation::GetInterpolationFactorAndKeys(int* out_key0, int* out_key1) const
{
	float t = time_since_iteration_start;

	if (reverse_direction)
		t = duration - t;

	int key0 = -1;
	int key1 = -1;

	{
		for (int i = 0; i < (int)keys.size(); i++)
		{
			if (keys[i].time >= t)
			{
				key1 = i;
				break;
			}
		}

		if (key1 < 0)
			key1 = (int)keys.size() - 1;
		key0 = (key1 == 0 ? 0 : key1 - 1);
	}

	RMLUI_ASSERT(key0 >= 0 && key0 < (int)keys.size() && key1 >= 0 && key1 < (int)keys.size());

	float alpha = 0.0f;

	{
		const float t0 = keys[key0].time;
		const float t1 = keys[key1].time;

		const float eps = 1e-3f;

		if (t1 - t0 > eps)
			alpha = (t - t0) / (t1 - t0);

		alpha = Math::Clamp(alpha, 0.0f, 1.0f);
	}

	alpha = keys[key1].tween(alpha);

	if (out_key0)
		*out_key0 = key0;
	if (out_key1)
		*out_key1 = key1;

	return alpha;
}